

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

void __thiscall ImGuiTableColumnSettings::ImGuiTableColumnSettings(ImGuiTableColumnSettings *this)

{
  ImGuiTableColumnSettings *this_local;
  
  this->WidthOrWeight = 0.0;
  this->UserID = 0;
  this->Index = -1;
  this->SortOrder = -1;
  this->DisplayOrder = -1;
  this->field_0xb = this->field_0xb & 0xfc;
  this->field_0xb = this->field_0xb & 0xfb | 4;
  this->field_0xb = this->field_0xb & 0xf7;
  return;
}

Assistant:

ImGuiTableColumnSettings()
    {
        WidthOrWeight = 0.0f;
        UserID = 0;
        Index = -1;
        DisplayOrder = SortOrder = -1;
        SortDirection = ImGuiSortDirection_None;
        IsEnabled = 1;
        IsStretch = 0;
    }